

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_test(stbi__context *s)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  uint uVar4;
  uint uVar5;
  
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) {
      uVar4 = 0;
      goto LAB_001085b0;
    }
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar2;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  uVar4 = 0;
  uVar5 = 0;
  if (*psVar3 != 'G') goto LAB_001085b0;
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001085b0;
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar2;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != 'I') goto LAB_001085b0;
  psVar3 = s->img_buffer;
  uVar4 = uVar5;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001085b0;
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar2;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != 'F') goto LAB_001085b0;
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001085b0;
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar2;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != '8') goto LAB_001085b0;
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_0010851f:
    s->img_buffer = psVar3 + 1;
    sVar1 = *psVar3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      psVar3 = s->img_buffer;
      goto LAB_0010851f;
    }
    sVar1 = '\0';
  }
  if ((sVar1 == '9') || (sVar1 == '7')) {
    psVar3 = s->img_buffer;
    if (s->img_buffer_end <= psVar3) {
      if (s->read_from_callbacks == 0) goto LAB_001085b0;
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      psVar3 = s->img_buffer;
    }
    s->img_buffer = psVar3 + 1;
    uVar4 = (uint)(*psVar3 == 'a');
  }
LAB_001085b0:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar4;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}